

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_save_indentation(Parser *this,size_t behind)

{
  code *pcVar1;
  Location LVar2;
  Location LVar3;
  bool bVar4;
  State *pSVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar9;
  char msg [90];
  char local_78 [88];
  undefined2 local_20;
  char *pcVar8;
  
  pSVar5 = this->m_state;
  pcVar9 = (pSVar5->line_contents).full.str;
  pcVar8 = (pSVar5->line_contents).rem.str;
  if (pcVar8 < pcVar9) {
    pcVar9 = 
    "check failed: (m_state->line_contents.rem.begin() >= m_state->line_contents.full.begin())";
    pcVar8 = local_78;
    for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined8 *)pcVar8 = *(undefined8 *)pcVar9;
      pcVar9 = pcVar9 + 8;
      pcVar8 = pcVar8 + 8;
    }
    local_20 = 0x29;
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x76c5) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x76c5) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_78,0x5a,LVar2,(this->m_stack).m_callbacks.m_user_data);
    pSVar5 = this->m_state;
    pcVar9 = (pSVar5->line_contents).full.str;
    pcVar8 = (pSVar5->line_contents).rem.str;
  }
  uVar7 = (long)pcVar8 - (long)pcVar9;
  pSVar5->indref = uVar7;
  if (uVar7 < behind) {
    builtin_strncpy(local_78 + 0x20,"->indref)",10);
    builtin_strncpy(local_78 + 0x10,"ehind <= m_state",0x10);
    builtin_strncpy(local_78,"check failed: (b",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x76c7) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x76c7) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_78,0x2a,LVar3,(this->m_stack).m_callbacks.m_user_data);
    pSVar5 = this->m_state;
    uVar7 = pSVar5->indref;
  }
  pSVar5->indref = uVar7 - behind;
  return;
}

Assistant:

void Parser::_save_indentation(size_t behind)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->line_contents.rem.begin() >= m_state->line_contents.full.begin());
    m_state->indref = static_cast<size_t>(m_state->line_contents.rem.begin() - m_state->line_contents.full.begin());
    _RYML_CB_ASSERT(m_stack.m_callbacks, behind <= m_state->indref);
    m_state->indref -= behind;
    _c4dbgpf("state[{}]: saving indentation: {}", m_state-m_stack.begin(), m_state->indref);
}